

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnFuncType
          (BinaryReaderIR *this,Index index,Index param_count,Type *param_types,Index result_count,
          Type *result_types)

{
  anon_struct_3_3_4b311855_for_features_used *paVar1;
  bool *pbVar2;
  Offset OVar3;
  int *piVar4;
  Module *pMVar5;
  long *plVar6;
  size_t sVar7;
  tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_> tVar8;
  undefined8 *puVar9;
  ulong uVar10;
  int *piVar11;
  char *pcVar12;
  long lVar13;
  int *piVar14;
  int *piVar15;
  long lVar16;
  int *piVar17;
  bool bVar18;
  __uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_38;
  
  if (1000 < param_count) {
    pcVar12 = "FuncType param count exceeds maximum value";
LAB_0014bc46:
    PrintError(this,pcVar12);
    return (Result)Error;
  }
  if (1000 < result_count) {
    pcVar12 = "FuncType result count exceeds maximum value";
    goto LAB_0014bc46;
  }
  pcVar12 = this->filename_;
  sVar7 = strlen(pcVar12);
  OVar3 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  tVar8.super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       operator_new(0x48);
  *(long *)((long)tVar8.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar8.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)tVar8.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x18) = sVar7;
  *(char **)((long)tVar8.
                   super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                   .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x20) =
       pcVar12;
  *(Offset *)
   ((long)tVar8.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x28) = OVar3;
  *(long *)((long)tVar8.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar8.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x38) = 4;
  *(undefined ***)
   tVar8.
   super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
   super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       &PTR__TypeModuleField_001937a8;
  *(long *)((long)tVar8.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) = 0;
  puVar9 = (undefined8 *)operator_new(0x88);
  puVar9[1] = 0;
  puVar9[2] = 0;
  *(undefined8 *)((long)puVar9 + 0x14) = 0;
  *(undefined8 *)((long)puVar9 + 0x1c) = 0;
  puVar9[5] = puVar9 + 7;
  puVar9[6] = 0;
  *(undefined1 *)(puVar9 + 7) = 0;
  *(undefined4 *)(puVar9 + 9) = 0;
  *puVar9 = &PTR__FuncType_00193850;
  puVar9[10] = 0;
  puVar9[0xb] = 0;
  puVar9[0xc] = 0;
  puVar9[0xd] = 0;
  puVar9[0xe] = 0;
  puVar9[0xf] = 0;
  *(undefined1 *)(puVar9 + 0x10) = 0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)(puVar9 + 10),param_types,
             param_types + param_count);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)(puVar9 + 0xd),result_types,
             result_types + result_count);
  piVar11 = (int *)puVar9[10];
  piVar4 = (int *)puVar9[0xb];
  uVar10 = (long)piVar4 - (long)piVar11;
  lVar13 = (long)uVar10 >> 5;
  piVar14 = piVar11;
  if (0 < lVar13) {
    piVar14 = (int *)((uVar10 & 0xffffffffffffffe0) + (long)piVar11);
    lVar16 = lVar13 + 1;
    piVar15 = piVar11 + 4;
    do {
      if (piVar15[-4] == -5) {
        piVar15 = piVar15 + -4;
        goto LAB_0014be34;
      }
      if (piVar15[-2] == -5) {
        piVar15 = piVar15 + -2;
        goto LAB_0014be34;
      }
      if (*piVar15 == -5) goto LAB_0014be34;
      if (piVar15[2] == -5) {
        piVar15 = piVar15 + 2;
        goto LAB_0014be34;
      }
      lVar16 = lVar16 + -1;
      piVar15 = piVar15 + 8;
    } while (1 < lVar16);
  }
  lVar16 = (long)piVar4 - (long)piVar14 >> 3;
  if (lVar16 == 1) {
LAB_0014be1c:
    piVar15 = piVar14;
    if (*piVar14 != -5) {
      piVar15 = piVar4;
    }
  }
  else if (lVar16 == 2) {
LAB_0014bdf3:
    piVar15 = piVar14;
    if (*piVar14 != -5) {
      piVar14 = piVar14 + 2;
      goto LAB_0014be1c;
    }
  }
  else {
    piVar15 = piVar4;
    if ((lVar16 == 3) && (piVar15 = piVar14, *piVar14 != -5)) {
      piVar14 = piVar14 + 2;
      goto LAB_0014bdf3;
    }
  }
LAB_0014be34:
  bVar18 = true;
  if (piVar15 == piVar4) {
    piVar14 = (int *)puVar9[0xd];
    piVar15 = (int *)puVar9[0xe];
    lVar16 = (long)piVar15 - (long)piVar14 >> 5;
    piVar17 = piVar14;
    if (0 < lVar16) {
      piVar17 = (int *)(((long)piVar15 - (long)piVar14 & 0xffffffffffffffe0U) + (long)piVar14);
      lVar16 = lVar16 + 1;
      piVar14 = piVar14 + 4;
      do {
        if (piVar14[-4] == -5) {
          piVar14 = piVar14 + -4;
          goto LAB_0014bf08;
        }
        if (piVar14[-2] == -5) {
          piVar14 = piVar14 + -2;
          goto LAB_0014bf08;
        }
        if (*piVar14 == -5) goto LAB_0014bf08;
        if (piVar14[2] == -5) {
          piVar14 = piVar14 + 2;
          goto LAB_0014bf08;
        }
        lVar16 = lVar16 + -1;
        piVar14 = piVar14 + 8;
      } while (1 < lVar16);
    }
    lVar16 = (long)piVar15 - (long)piVar17 >> 3;
    if (lVar16 == 1) {
LAB_0014bee4:
      piVar14 = piVar17;
      if (*piVar17 != -5) {
        piVar14 = piVar15;
      }
    }
    else if (lVar16 == 2) {
LAB_0014bed3:
      piVar14 = piVar17;
      if (*piVar17 != -5) {
        piVar17 = piVar17 + 2;
        goto LAB_0014bee4;
      }
    }
    else {
      piVar14 = piVar15;
      if ((lVar16 == 3) && (piVar14 = piVar17, *piVar17 != -5)) {
        piVar17 = piVar17 + 2;
        goto LAB_0014bed3;
      }
    }
LAB_0014bf08:
    bVar18 = piVar14 != piVar15;
  }
  pMVar5 = this->module_;
  paVar1 = &pMVar5->features_used;
  paVar1->simd = (bool)(paVar1->simd | bVar18);
  piVar14 = piVar11;
  if (0 < lVar13) {
    piVar14 = (int *)((uVar10 & 0xffffffffffffffe0) + (long)piVar11);
    lVar13 = lVar13 + 1;
    piVar11 = piVar11 + 4;
    do {
      if (piVar11[-4] == -0x17) {
        piVar11 = piVar11 + -4;
        goto LAB_0014bfa4;
      }
      if (piVar11[-2] == -0x17) {
        piVar11 = piVar11 + -2;
        goto LAB_0014bfa4;
      }
      if (*piVar11 == -0x17) goto LAB_0014bfa4;
      if (piVar11[2] == -0x17) {
        piVar11 = piVar11 + 2;
        goto LAB_0014bfa4;
      }
      lVar13 = lVar13 + -1;
      piVar11 = piVar11 + 8;
    } while (1 < lVar13);
  }
  lVar13 = (long)piVar4 - (long)piVar14 >> 3;
  if (lVar13 == 1) {
LAB_0014bf88:
    piVar11 = piVar14;
    if (*piVar14 != -0x17) {
      piVar11 = piVar4;
    }
  }
  else if (lVar13 == 2) {
LAB_0014bf7f:
    piVar11 = piVar14;
    if (*piVar14 != -0x17) {
      piVar14 = piVar14 + 2;
      goto LAB_0014bf88;
    }
  }
  else {
    piVar11 = piVar4;
    if ((lVar13 == 3) && (piVar11 = piVar14, *piVar14 != -0x17)) {
      piVar14 = piVar14 + 2;
      goto LAB_0014bf7f;
    }
  }
LAB_0014bfa4:
  bVar18 = true;
  if (piVar11 != piVar4) goto LAB_0014c054;
  piVar11 = (int *)puVar9[0xd];
  piVar4 = (int *)puVar9[0xe];
  lVar13 = (long)piVar4 - (long)piVar11 >> 5;
  piVar14 = piVar11;
  if (0 < lVar13) {
    piVar14 = (int *)(((long)piVar4 - (long)piVar11 & 0xffffffffffffffe0U) + (long)piVar11);
    lVar13 = lVar13 + 1;
    piVar11 = piVar11 + 4;
    do {
      if (piVar11[-4] == -0x17) {
        piVar11 = piVar11 + -4;
        goto LAB_0014c04e;
      }
      if (piVar11[-2] == -0x17) {
        piVar11 = piVar11 + -2;
        goto LAB_0014c04e;
      }
      if (*piVar11 == -0x17) goto LAB_0014c04e;
      if (piVar11[2] == -0x17) {
        piVar11 = piVar11 + 2;
        goto LAB_0014c04e;
      }
      lVar13 = lVar13 + -1;
      piVar11 = piVar11 + 8;
    } while (1 < lVar13);
  }
  lVar13 = (long)piVar4 - (long)piVar14 >> 3;
  if (lVar13 == 1) {
LAB_0014c032:
    piVar11 = piVar14;
    if (*piVar14 != -0x17) {
      piVar11 = piVar4;
    }
  }
  else if (lVar13 == 2) {
LAB_0014c029:
    piVar11 = piVar14;
    if (*piVar14 != -0x17) {
      piVar14 = piVar14 + 2;
      goto LAB_0014c032;
    }
  }
  else {
    piVar11 = piVar4;
    if ((lVar13 == 3) && (piVar11 = piVar14, *piVar14 != -0x17)) {
      piVar14 = piVar14 + 2;
      goto LAB_0014c029;
    }
  }
LAB_0014c04e:
  bVar18 = piVar11 != piVar4;
LAB_0014c054:
  pbVar2 = &(pMVar5->features_used).exceptions;
  *pbVar2 = (bool)(*pbVar2 | bVar18);
  plVar6 = *(long **)((long)tVar8.
                            super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                            .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl +
                     0x40);
  *(undefined8 **)
   ((long)tVar8.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) = puVar9;
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 8))();
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       tVar8.
       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
       super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)&local_38);
  if ((_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
      local_38._M_t.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl != (TypeModuleField *)0x0)
  {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8))
              ();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnFuncType(Index index,
                                  Index param_count,
                                  Type* param_types,
                                  Index result_count,
                                  Type* result_types) {
  if (param_count > kMaxFunctionParams) {
    PrintError("FuncType param count exceeds maximum value");
    return Result::Error;
  }

  if (result_count > kMaxFunctionResults) {
    PrintError("FuncType result count exceeds maximum value");
    return Result::Error;
  }

  auto field = std::make_unique<TypeModuleField>(GetLocation());
  auto func_type = std::make_unique<FuncType>();
  func_type->sig.param_types.assign(param_types, param_types + param_count);
  func_type->sig.result_types.assign(result_types, result_types + result_count);

  module_->features_used.simd |=
      std::any_of(func_type->sig.param_types.begin(),
                  func_type->sig.param_types.end(),
                  [](auto x) { return x == Type::V128; }) ||
      std::any_of(func_type->sig.result_types.begin(),
                  func_type->sig.result_types.end(),
                  [](auto x) { return x == Type::V128; });
  module_->features_used.exceptions |=
      std::any_of(func_type->sig.param_types.begin(),
                  func_type->sig.param_types.end(),
                  [](auto x) { return x == Type::ExnRef; }) ||
      std::any_of(func_type->sig.result_types.begin(),
                  func_type->sig.result_types.end(),
                  [](auto x) { return x == Type::ExnRef; });

  field->type = std::move(func_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}